

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

void __thiscall
Memory::HeapBlockMap64::VerifyMarkCountForPages<256u>
          (HeapBlockMap64 *this,void *address,uint pageCount)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  Node *pNVar4;
  undefined8 *in_FS_OFFSET;
  
  pNVar4 = FindNode(this,address);
  if (pNVar4 == (Node *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x610,"(node != nullptr)","node != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  HeapBlockMap32::VerifyMarkCountForPages<256u>(&pNVar4->map,address,pageCount);
  return;
}

Assistant:

void
HeapBlockMap64::VerifyMarkCountForPages(void * address, uint pageCount)
{
    Node * node = FindNode(address);
    Assert(node != nullptr);

    node->map.VerifyMarkCountForPages<BitVectorCount>(address, pageCount);
}